

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::method(Parser *this,ptr<ObjectExpression> *descriptor,Scope scope)

{
  ObjectExpression *this_00;
  undefined1 local_b0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  ptr<Function> function;
  Identifier identifier;
  IdentifierList parameters;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48 [2];
  __shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  consume(this);
  Token::Token((Token *)&parameters,&this->currentToken);
  identifier._M_dataplus._M_p = (pointer)&identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)parameters.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish == local_48) {
    identifier.field_2._8_8_ = local_48[0]._8_8_;
  }
  else {
    identifier._M_dataplus._M_p =
         (pointer)parameters.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
  }
  identifier._M_string_length =
       (size_type)
       parameters.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  parameters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48[0]._M_local_buf[0] = '\0';
  parameters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_48;
  std::__cxx11::string::~string
            ((string *)
             &parameters.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  consume(this,Identifier,"identifier");
  consume(this,LeftParen,"\'(\'");
  identifierList_abi_cxx11_(&parameters,this);
  consume(this,RightParen,"\')\'");
  std::
  make_shared<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_b0 + 0x10));
  statementBlock((Parser *)local_b0);
  std::
  make_shared<Function,std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&,std::shared_ptr<StatementBlock>&>
            ((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&function,(shared_ptr<StatementBlock> *)(local_b0 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  this_00 = (descriptor->super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&function.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>);
  ObjectExpression::putFunction(this_00,&identifier,scope,(ptr<Function> *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&function.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parameters);
  std::__cxx11::string::~string((string *)&identifier);
  return;
}

Assistant:

void Parser::method(ptr<ObjectExpression> &descriptor, Scope scope) {
    consume();

    Identifier identifier = token().lexeme;
    consume(TokenType::Identifier, "identifier");

    consume(TokenType::LeftParen, "'('");
    IdentifierList parameters = identifierList();
    consume(TokenType::RightParen, "')'");

    ptr<Function> function = make<Function>(make<IdentifierList>(parameters), statementBlock());
    descriptor -> putFunction(identifier, scope, function);
}